

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  ulong uVar1;
  size_t __n;
  size_t chunk_len;
  size_t bufsize;
  size_t len_local;
  uchar *data_local;
  secp256k1_sha256 *hash_local;
  
  uVar1 = hash->bytes;
  hash->bytes = len + hash->bytes;
  chunk_len = uVar1 & 0x3f;
  bufsize = len;
  len_local = (size_t)data;
  while (0x40 - chunk_len <= bufsize) {
    __n = 0x40 - chunk_len;
    memcpy((void *)((long)hash->buf + chunk_len),(void *)len_local,__n);
    len_local = __n + len_local;
    bufsize = bufsize - __n;
    secp256k1_sha256_transform(hash->s,hash->buf);
    chunk_len = 0;
  }
  if (bufsize != 0) {
    memcpy((void *)((long)hash->buf + chunk_len),(void *)len_local,bufsize);
  }
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(((unsigned char*)hash->buf) + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}